

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  int iVar1;
  Field *in_RCX;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  Field *in_RSI;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int i_1;
  int size;
  int i;
  int other_size;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff40;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  Field *in_stack_ffffffffffffff78;
  int local_78;
  int in_stack_ffffffffffffff8c;
  Field *in_stack_ffffffffffffff90;
  RepeatedFieldAccessor *in_stack_ffffffffffffff98;
  int local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  Field *local_10;
  
  local_38.field_2._8_8_ = in_RCX;
  if (in_RDI == in_RDX) {
    RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MutableRepeatedField(in_RSI);
    RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MutableRepeatedField((Field *)local_38.field_2._8_8_);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    value = &local_38;
    local_18 = in_RDX;
    local_10 = in_RSI;
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x42edb1);
    RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MutableRepeatedField(local_10);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Swap(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    iVar1 = (*(code *)(((local_18->super_RepeatedPtrFieldBase).arena_)->impl_).hint_._M_b._M_p)
                      (local_18,local_38.field_2._8_8_);
    for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
      RepeatedFieldAccessor::Get<std::__cxx11::string>
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)in_RDI,in_stack_ffffffffffffff78,value);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    iVar1 = RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Size((RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff40,
                   (Field *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    (*(code *)(((local_18->super_RepeatedPtrFieldBase).arena_)->impl_).initial_block_)
              (local_18,local_38.field_2._8_8_);
    for (local_78 = 0; local_78 < iVar1; local_78 = local_78 + 1) {
      in_stack_ffffffffffffff40 = local_18;
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Get(local_18,in_stack_ffffffffffffff3c);
      RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                ((RepeatedFieldAccessor *)in_RDI,in_stack_ffffffffffffff78,value);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField(in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }